

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<short,short>::
Flush<duckdb::BitpackingCompressionState<short,true,short>::BitpackingWriter>
          (BitpackingState<short,short> *this)

{
  BitpackingState<short,short> *result;
  BitpackingState<short,short> *values;
  short *psVar1;
  short sVar2;
  idx_t iVar3;
  short *values_00;
  ushort uVar4;
  BitpackingState<short,short> BVar5;
  byte bVar6;
  ushort uVar7;
  unsigned_long uVar8;
  uint uVar9;
  idx_t iVar10;
  byte bVar11;
  bool bVar12;
  byte bVar13;
  ulong uVar14;
  
  bVar12 = true;
  if (*(idx_t *)(this + 0x2810) != 0) {
    if (((this[0x2837] == (BitpackingState<short,short>)0x0) &&
        (*(short *)(this + 0x282a) != *(short *)(this + 0x2828))) ||
       (1 < (byte)((char)this[0x283a] - 1U))) {
      result = this + 0x282c;
      BVar5 = (BitpackingState<short,short>)
              TrySubtractOperator::Operation<short,short,short>
                        (*(int16_t *)(this + 0x282a),*(int16_t *)(this + 0x2828),(int16_t *)result);
      this[0x2839] = BVar5;
      BitpackingState<short,_short>::CalculateDeltaStats((BitpackingState<short,_short> *)this);
      if (this[0x2838] == (BitpackingState<short,short>)0x1) {
        sVar2 = *(short *)(this + 0x282e);
        if ((*(short *)(this + 0x2830) == sVar2) && (((byte)this[0x283a] & 0xfe) != 4)) {
          BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteConstantDelta
                    (*(short *)(this + 0x2830),**(short **)(this + 0x1008),*(idx_t *)(this + 0x2810)
                     ,*(short **)(this + 0x1008),(bool *)(this + 0x2010),*(void **)(this + 0x2820));
          *(long *)(this + 0x2818) = *(long *)(this + 0x2818) + 8;
          return true;
        }
        uVar9 = (uint)*(ushort *)(this + 0x2832);
        bVar11 = 0;
        bVar6 = bVar11;
        if (*(ushort *)(this + 0x2832) != 0) {
          do {
            bVar11 = bVar11 + 1;
            uVar7 = (ushort)uVar9;
            uVar9 = (uint)(int)(short)uVar7 >> 1;
          } while (1 < uVar7);
          bVar6 = 0x10;
          if (bVar11 < 0xf) {
            bVar6 = bVar11;
          }
        }
        uVar7 = *(ushort *)result;
        if (uVar7 == 0) {
          bVar11 = 0;
        }
        else {
          bVar11 = 0x10;
          if (uVar7 != 0x8000) {
            uVar4 = -uVar7;
            if (0 < (short)uVar7) {
              uVar4 = uVar7;
            }
            uVar9 = (uint)uVar4;
            bVar13 = 1;
            do {
              bVar13 = bVar13 + 1;
              uVar7 = (ushort)uVar9;
              uVar9 = (uint)(int)(short)uVar7 >> 1;
            } while (1 < uVar7);
            bVar11 = 0x10;
            if (bVar13 < 0xf) {
              bVar11 = bVar13;
            }
          }
        }
        BVar5 = this[0x283a];
        if (BVar5 != (BitpackingState<short,short>)0x5 && bVar6 < bVar11) {
          values = this + 0x1010;
          iVar3 = *(idx_t *)(this + 0x2810);
          if (iVar3 != 0) {
            iVar10 = 0;
            do {
              *(short *)(values + iVar10 * 2) = *(short *)(values + iVar10 * 2) - sVar2;
              iVar10 = iVar10 + 1;
            } while (iVar3 != iVar10);
          }
          BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteDeltaFor
                    ((short *)values,(bool *)(this + 0x2010),bVar6,*(short *)(this + 0x282e),
                     *(short *)(this + 0x2834),*(short **)(this + 0x1008),iVar3,
                     *(void **)(this + 0x2820));
          *(long *)(this + 0x2818) = *(long *)(this + 0x2818) + 0xc;
          uVar14 = *(ulong *)(this + 0x2810);
          if ((uVar14 & 0x1f) != 0) {
            uVar8 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar14 & 0x1f);
            uVar14 = (uVar14 - uVar8) + 0x20;
          }
          *(ulong *)(this + 0x2818) = *(long *)(this + 0x2818) + (bVar6 * uVar14 >> 3);
          if (BVar5 != (BitpackingState<short,short>)0x5 && bVar6 < bVar11) {
            return true;
          }
        }
      }
      if (this[0x2839] == (BitpackingState<short,short>)0x1) {
        uVar9 = (uint)*(ushort *)result;
        if (*(ushort *)result == 0) {
          bVar6 = 0;
        }
        else {
          bVar11 = 0;
          do {
            bVar11 = bVar11 + 1;
            uVar7 = (ushort)uVar9;
            uVar9 = (uint)(int)(short)uVar7 >> 1;
          } while (1 < uVar7);
          bVar6 = 0x10;
          if (bVar11 < 0xf) {
            bVar6 = bVar11;
          }
        }
        values_00 = *(short **)(this + 0x1008);
        iVar3 = *(idx_t *)(this + 0x2810);
        if (iVar3 != 0) {
          sVar2 = *(short *)(this + 0x2828);
          iVar10 = 0;
          do {
            psVar1 = values_00 + iVar10;
            *psVar1 = *psVar1 - sVar2;
            iVar10 = iVar10 + 1;
          } while (iVar3 != iVar10);
        }
        BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteFor
                  (values_00,(bool *)(this + 0x2010),bVar6,*(short *)(this + 0x2828),iVar3,
                   *(void **)(this + 0x2820));
        uVar14 = *(ulong *)(this + 0x2810);
        if ((uVar14 & 0x1f) != 0) {
          uVar8 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar14 & 0x1f);
          uVar14 = (uVar14 - uVar8) + 0x20;
        }
        *(ulong *)(this + 0x2818) = *(long *)(this + 0x2818) + (bVar6 * uVar14 >> 3) + 10;
      }
      else {
        bVar12 = false;
      }
    }
    else {
      BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteConstant
                (*(short *)(this + 0x282a),*(idx_t *)(this + 0x2810),*(void **)(this + 0x2820),
                 (bool)this[0x2837]);
      *(long *)(this + 0x2818) = *(long *)(this + 0x2818) + 6;
    }
  }
  return bVar12;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}